

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  ulong uVar4;
  cmGraphEdge *ni;
  pointer pcVar5;
  bool local_45;
  int j_component;
  ulong local_40;
  ulong local_38;
  
  uVar4 = ((long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>)
                 .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  local_38 = 0;
  local_40 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    local_40 = local_38;
  }
  for (; local_38 != local_40; local_38 = local_38 + 1) {
    iVar1 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_38];
    pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = *(pointer *)((long)(pcVar2 + local_38) + 8);
    for (pcVar5 = *(pointer *)
                   &pcVar2[local_38].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar5 != pcVar3; pcVar5 = pcVar5 + 1) {
      j_component = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[pcVar5->Dest];
      if (iVar1 != j_component) {
        local_45 = pcVar5->Strong;
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int&,bool,cmListFileBacktrace_const&>
                  ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   ((this->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar1),&j_component,&local_45,
                   &pcVar5->Backtrace);
      }
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.GetBacktrace());
      }
    }
  }
}